

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void __thiscall
llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
opt<char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
          (opt<bool,false,llvm::cl::parser<bool>> *this,char (*Ms) [18],desc *Ms_1,
          OptionHidden *Ms_2,initializer<bool> *Ms_3,cat *Ms_4,sub *Ms_5)

{
  Option::Option((Option *)this,Optional,NotHidden);
  this[0x98] = (opt<bool,false,llvm::cl::parser<bool>>)0x0;
  *(undefined ***)(this + 0xa0) = &PTR_compare_001c2d78;
  *(undefined2 *)(this + 0xa8) = 0x100;
  *(undefined ***)this = &PTR_handleOccurrence_001c2c90;
  *(undefined ***)(this + 0xb0) = &PTR_getValueName_001c2780;
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this,Ms,Ms_1,Ms_2,Ms_3,Ms_4,Ms_5);
  Option::addArgument((Option *)this);
  return;
}

Assistant:

explicit opt(const Mods &... Ms)
      : Option(Optional, NotHidden), Parser(*this) {
    apply(this, Ms...);
    done();
  }